

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int64_t atol8(char *p,uint char_cnt)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; (char_cnt != (uint)lVar2 && ((p[lVar2] & 0xf8U) == 0x30)); lVar2 = lVar2 + 1) {
    lVar1 = (ulong)(byte)(p[lVar2] - 0x30) + lVar1 * 8;
  }
  return lVar1;
}

Assistant:

static int64_t
atol8(const char *p, unsigned char_cnt)
{
	int64_t l;
	int digit;

	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= '0' && *p <= '7')
			digit = *p - '0';
		else
			return (l);
		p++;
		l <<= 3;
		l |= digit;
	}
	return (l);
}